

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

void __thiscall gurkenlaeufer::Parser::parseFile(Parser *this,string *filePath)

{
  invalid_argument *this_00;
  long *plVar1;
  long *plVar2;
  ifstream fin;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(string *)filePath,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    parseStream(this,(istream *)local_228);
    std::ifstream::~ifstream(local_228);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_248,"The given cucumber feature file \'",filePath);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_268 == plVar2) {
    local_258 = *plVar2;
    lStack_250 = plVar1[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar2;
  }
  local_260 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_268);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void parseFile(const std::string& filePath)
    {
        std::ifstream fin(filePath);
        if (fin.fail()) {
            throw std::invalid_argument("The given cucumber feature file '" + filePath + "' can not be opened!");
        }
        parseStream(&fin);
    }